

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall
p2t::Sweep::FillLeftConvexEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Node *pNVar1;
  Point *pc;
  Orientation OVar2;
  Node *node_00;
  Point *pa;
  Point *pb;
  Node *pNVar3;
  
  node_00 = node->prev;
  pa = node_00->point;
  pb = node_00->prev->point;
  pNVar3 = node_00->prev;
  do {
    pNVar1 = pNVar3->prev;
    pc = pNVar1->point;
    OVar2 = Orient2d(pa,pb,pc);
    if (OVar2 == CW) {
      FillLeftConcaveEdgeEvent(this,tcx,edge,node_00);
      return;
    }
    OVar2 = Orient2d(edge->q,pb,edge->p);
    node_00 = pNVar3;
    pa = pb;
    pb = pc;
    pNVar3 = pNVar1;
  } while (OVar2 == CW);
  return;
}

Assistant:

void Sweep::FillLeftConvexEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  // Next concave or convex?
  if (Orient2d(*node.prev->point, *node.prev->prev->point, *node.prev->prev->prev->point) == CW) {
    // Concave
    FillLeftConcaveEdgeEvent(tcx, edge, *node.prev);
  } else{
    // Convex
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.prev->prev->point, *edge->p) == CW) {
      // Below
      FillLeftConvexEdgeEvent(tcx, edge, *node.prev);
    } else{
      // Above
    }
  }
}